

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

int ipc_listener_get(void *arg,char *name,void *buf,size_t *szp,nni_type t)

{
  int iVar1;
  
  iVar1 = nni_getopt(ipc_ep_options,name,arg,buf,szp,t);
  if (iVar1 == 9) {
    iVar1 = nni_stream_listener_get(*(nng_stream_listener **)((long)arg + 0x40),name,buf,szp,t);
    return iVar1;
  }
  return iVar1;
}

Assistant:

static int
ipc_listener_get(
    void *arg, const char *name, void *buf, size_t *szp, nni_type t)
{
	ipc_ep *ep = arg;
	int     rv;

	rv = nni_getopt(ipc_ep_options, name, ep, buf, szp, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_stream_listener_get(ep->listener, name, buf, szp, t);
	}
	return (rv);
}